

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypePrimitiveWriter.cpp
# Opt level: O0

EStatusCode __thiscall
TrueTypePrimitiveWriter::WriteBYTE(TrueTypePrimitiveWriter *this,Byte inValue)

{
  int iVar1;
  undefined4 extraout_var;
  Byte local_19;
  EStatusCode status;
  Byte inValue_local;
  TrueTypePrimitiveWriter *this_local;
  
  if (this->mInternalState == eFailure) {
    this_local._4_4_ = eFailure;
  }
  else {
    local_19 = inValue;
    _status = this;
    iVar1 = (*(this->mTrueTypeFile->super_IByteWriterWithPosition).super_IByteWriter.
              _vptr_IByteWriter[2])(this->mTrueTypeFile,&local_19,1);
    this_local._4_4_ = eFailure;
    if (CONCAT44(extraout_var,iVar1) == 1) {
      this_local._4_4_ = eSuccess;
    }
    if (this_local._4_4_ == eFailure) {
      this->mInternalState = eFailure;
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode TrueTypePrimitiveWriter::WriteBYTE(Byte inValue)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mTrueTypeFile->Write(&inValue,1) == 1 ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}